

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RadialDistrFunc.cpp
# Opt level: O2

void __thiscall
OpenMD::RadialDistrFunc::RadialDistrFunc
          (RadialDistrFunc *this,SimInfo *info,string *filename,string *sele1,string *sele2,
          uint nbins)

{
  SelectionEvaluator *this_00;
  SelectionEvaluator *this_01;
  SelectionManager *this_02;
  SelectionManager *this_03;
  SelectionManager *this_04;
  int iVar1;
  SelectionManager local_f8;
  
  StaticAnalyser::StaticAnalyser(&this->super_StaticAnalyser,info,filename,nbins);
  (this->super_StaticAnalyser)._vptr_StaticAnalyser = (_func_int **)&PTR__RadialDistrFunc_002ee248;
  std::__cxx11::string::string((string *)&this->selectionScript1_,(string *)sele1);
  std::__cxx11::string::string((string *)&this->selectionScript2_,(string *)sele2);
  this_00 = &this->evaluator1_;
  SelectionEvaluator::SelectionEvaluator(this_00,info);
  this_01 = &this->evaluator2_;
  SelectionEvaluator::SelectionEvaluator(this_01,info);
  this_02 = &this->seleMan1_;
  SelectionManager::SelectionManager(this_02,info);
  this_03 = &this->seleMan2_;
  SelectionManager::SelectionManager(this_03,info);
  SelectionManager::SelectionManager(&this->sele1_minus_common_,info);
  SelectionManager::SelectionManager(&this->sele2_minus_common_,info);
  this_04 = &this->common_;
  SelectionManager::SelectionManager(this_04,info);
  SelectionEvaluator::loadScriptString(this_00,sele1);
  SelectionEvaluator::loadScriptString(this_01,sele2);
  if ((this->evaluator1_).isDynamic_ == false) {
    SelectionEvaluator::evaluate((SelectionSet *)&local_f8,this_00);
    SelectionManager::setSelectionSet(this_02,(SelectionSet *)&local_f8);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)&local_f8);
    (*(this->super_StaticAnalyser)._vptr_StaticAnalyser[0xb])(this,this_02);
  }
  if ((this->evaluator2_).isDynamic_ == false) {
    SelectionEvaluator::evaluate((SelectionSet *)&local_f8,this_01);
    SelectionManager::setSelectionSet(this_03,(SelectionSet *)&local_f8);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)&local_f8);
    (*(this->super_StaticAnalyser)._vptr_StaticAnalyser[0xc])(this,this_03);
  }
  if (((this->evaluator1_).isDynamic_ == false) && ((this->evaluator2_).isDynamic_ == false)) {
    operator&(&local_f8,this_02,this_03);
    SelectionManager::operator=(this_04,&local_f8);
    SelectionManager::~SelectionManager(&local_f8);
    operator-(&local_f8,this_02,this_04);
    SelectionManager::operator=(&this->sele1_minus_common_,&local_f8);
    SelectionManager::~SelectionManager(&local_f8);
    operator-(&local_f8,this_03,this_04);
    SelectionManager::operator=(&this->sele2_minus_common_,&local_f8);
    SelectionManager::~SelectionManager(&local_f8);
    iVar1 = SelectionManager::getSelectionCount(this_02);
    this->nSelected1_ = iVar1;
    iVar1 = SelectionManager::getSelectionCount(this_03);
    this->nSelected2_ = iVar1;
    iVar1 = SelectionManager::getSelectionCount(this_04);
    this->nPairs_ = ((iVar1 + 1) * iVar1) / -2 + this->nSelected2_ * this->nSelected1_;
  }
  return;
}

Assistant:

RadialDistrFunc::RadialDistrFunc(SimInfo* info, const std::string& filename,
                                   const std::string& sele1,
                                   const std::string& sele2,
                                   unsigned int nbins) :
      StaticAnalyser(info, filename, nbins),
      selectionScript1_(sele1), selectionScript2_(sele2), evaluator1_(info),
      evaluator2_(info), seleMan1_(info), seleMan2_(info),
      sele1_minus_common_(info), sele2_minus_common_(info), common_(info) {
    evaluator1_.loadScriptString(sele1);
    evaluator2_.loadScriptString(sele2);

    if (!evaluator1_.isDynamic()) {
      seleMan1_.setSelectionSet(evaluator1_.evaluate());
      validateSelection1(seleMan1_);
    }
    if (!evaluator2_.isDynamic()) {
      seleMan2_.setSelectionSet(evaluator2_.evaluate());
      validateSelection2(seleMan2_);
    }

    if (!evaluator1_.isDynamic() && !evaluator2_.isDynamic()) {
      // If all selections are static, we can precompute the number
      // of real pairs.
      common_             = seleMan1_ & seleMan2_;
      sele1_minus_common_ = seleMan1_ - common_;
      sele2_minus_common_ = seleMan2_ - common_;

      nSelected1_    = seleMan1_.getSelectionCount();
      nSelected2_    = seleMan2_.getSelectionCount();
      int nIntersect = common_.getSelectionCount();

      nPairs_ = nSelected1_ * nSelected2_ - (nIntersect + 1) * nIntersect / 2;
    }
  }